

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_regen_mana(player *p)

{
  short sVar1;
  _Bool _Var2;
  int32_t iVar3;
  uint local_18;
  wchar_t old_csp;
  wchar_t percent;
  int32_t sp_gain;
  player *p_local;
  
  sVar1 = p->csp;
  local_18 = 0xc5;
  _Var2 = flag_has_dbg((p->state).pflags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)");
  if ((!_Var2) || ((int)p->chp <= (int)p->mhp / 2)) {
    _Var2 = player_of_has(p,L'\f');
    if (_Var2) {
      local_18 = 0x18a;
    }
    _Var2 = player_resting_can_regenerate(p);
    if (_Var2) {
      local_18 = local_18 << 1;
    }
    _Var2 = flag_has_dbg((p->state).pflags,10,0x4b,"p->state.pflags","(PF_MEDITATION)");
    if (_Var2) {
      local_18 = local_18 << 1;
    }
  }
  _Var2 = flag_has_dbg((p->state).pflags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)");
  if (_Var2) {
    local_18 = (int)local_18 / -2;
  }
  else {
    _Var2 = player_of_has(p,L'\x1b');
    if (_Var2) {
      local_18 = local_18 / 2;
    }
  }
  old_csp = (int)p->msp * local_18;
  if (-1 < (int)local_18) {
    old_csp = old_csp + L'Ȍ';
  }
  iVar3 = player_adjust_mana_precise(p,old_csp);
  if ((iVar3 < 0) &&
     (_Var2 = flag_has_dbg((p->state).pflags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)"), _Var2))
  {
    convert_mana_to_hp(p,iVar3 * -2);
  }
  if (sVar1 != p->csp) {
    p->upkeep->redraw = p->upkeep->redraw | 0x80;
    equip_learn_flag(p,L'\f');
    equip_learn_flag(p,L'\x1b');
  }
  return;
}

Assistant:

void player_regen_mana(struct player *p)
{
	int32_t sp_gain;
	int percent, old_csp = p->csp;

	/* Save the old spell points */
	old_csp = p->csp;

	/* Default regeneration */
	percent = PY_REGEN_NORMAL;

	/* Various things speed up regeneration, but shouldn't punish healthy BGs */
	if (!(player_has(p, PF_COMBAT_REGEN) && p->chp  > p->mhp / 2)) {
		if (player_of_has(p, OF_REGEN))
			percent *= 2;
		if (player_resting_can_regenerate(p))
			percent *= 2;
		if (player_has(p, PF_MEDITATION))
			percent *= 2;
	}

	/* Some things slow it down */
	if (player_has(p, PF_COMBAT_REGEN)) {
		percent /= -2;
	} else if (player_of_has(p, OF_IMPAIR_MANA)) {
		percent /= 2;
	}

	/* Regenerate mana */
	sp_gain = (int32_t)(p->msp * percent);
	if (percent >= 0)
		sp_gain += PY_REGEN_MNBASE;
	sp_gain = player_adjust_mana_precise(p, sp_gain);

	/* SP degen heals BGs at double efficiency vs casting */
	if (sp_gain < 0  && player_has(p, PF_COMBAT_REGEN)) {
		convert_mana_to_hp(p, -sp_gain * 2);
	}

	/* Notice changes */
	if (old_csp != p->csp) {
		p->upkeep->redraw |= (PR_MANA);
		equip_learn_flag(p, OF_REGEN);
		equip_learn_flag(p, OF_IMPAIR_MANA);
	}
}